

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O2

void MNS::Server::onSecondTimer(uv_timer_t *handle)

{
  tm *__tp;
  time_t t;
  char strt [100];
  
  t = time((time_t *)0x0);
  __tp = gmtime(&t);
  strftime(strt,100,"%a, %e %b %Y %H:%M:%S GMT",__tp);
  std::__cxx11::string::assign((char *)&currTime_abi_cxx11_);
  return;
}

Assistant:

void MNS::Server::onSecondTimer(uv_timer_t *handle) {
	char strt[100];
	std::time_t t = std::time(NULL);
	std::strftime(strt, 100, "%a, %e %b %Y %H:%M:%S GMT\0", std::gmtime(&t));

	MNS::Server::currTime = strt;
}